

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O1

int htmlParseDocument(htmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  setDocumentLocatorSAXFunc p_Var2;
  startDocumentSAXFunc p_Var3;
  xmlParserInputPtr pxVar4;
  xmlChar *pxVar5;
  __int32_t *p_Var6;
  endDocumentSAXFunc p_Var7;
  int iVar8;
  __int32_t **pp_Var9;
  xmlDtdPtr pxVar10;
  int iVar11;
  xmlChar *pxVar12;
  
  iVar8 = -1;
  if ((ctxt != (htmlParserCtxtPtr)0x0) && (ctxt->input != (xmlParserInputPtr)0x0)) {
    if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
       (p_Var2 = ctxt->sax->setDocumentLocator, p_Var2 != (setDocumentLocatorSAXFunc)0x0)) {
      (*p_Var2)(ctxt->userData,&xmlDefaultSAXLocator);
    }
    xmlDetectEncoding(ctxt);
    if (((ctxt->input->flags & 1) == 0) &&
       (iVar8 = xmlStrncmp(ctxt->input->cur,(xmlChar *)"<?xm",4), iVar8 == 0)) {
      xmlSwitchEncoding(ctxt,XML_CHAR_ENCODING_UTF8);
    }
    htmlSkipBlankChars(ctxt);
    if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
        (p_Var3 = ctxt->sax->startDocument, p_Var3 != (startDocumentSAXFunc)0x0)) &&
       (ctxt->disableSAX == 0)) {
      (*p_Var3)(ctxt->userData);
    }
    pxVar4 = ctxt->input;
    pxVar5 = pxVar4->cur;
    xVar1 = *pxVar5;
    while (xVar1 == '<') {
      pxVar12 = pxVar5 + 1;
      iVar8 = 1;
      if (pxVar5[1] == '?') {
        iVar11 = 1;
      }
      else {
        if (((pxVar5[1] != '!') || (pxVar5[2] != '-')) || (pxVar5[3] != '-')) {
          if ((xVar1 == '<') && (pxVar5[1] == '!')) {
            pp_Var9 = __ctype_toupper_loc();
            p_Var6 = *pp_Var9;
            if ((((p_Var6[pxVar5[2]] == 0x44) &&
                 (((p_Var6[pxVar5[3]] == 0x4f && (p_Var6[pxVar5[4]] == 0x43)) &&
                  (p_Var6[pxVar5[5]] == 0x54)))) &&
                ((p_Var6[pxVar5[6]] == 0x59 && (p_Var6[pxVar5[7]] == 0x50)))) &&
               (p_Var6[pxVar5[8]] == 0x45)) {
              ctxt->instate = XML_PARSER_MISC;
              htmlParseDocTypeDecl(ctxt);
            }
          }
          break;
        }
        pxVar12 = pxVar5 + 4;
        iVar11 = 0;
        iVar8 = 4;
      }
      pxVar4->cur = pxVar12;
      pxVar4->col = pxVar4->col + iVar8;
      htmlParseComment(ctxt,iVar11);
      htmlSkipBlankChars(ctxt);
      pxVar4 = ctxt->input;
      pxVar5 = pxVar4->cur;
      xVar1 = *pxVar5;
    }
    htmlSkipBlankChars(ctxt);
    ctxt->instate = XML_PARSER_PROLOG;
    pxVar4 = ctxt->input;
    pxVar5 = pxVar4->cur;
    xVar1 = *pxVar5;
    while (xVar1 == '<') {
      pxVar12 = pxVar5 + 1;
      iVar8 = 1;
      if (pxVar5[1] == '?') {
        iVar11 = 1;
      }
      else {
        if (((pxVar5[1] != '!') || (pxVar5[2] != '-')) || (pxVar5[3] != '-')) break;
        pxVar12 = pxVar5 + 4;
        iVar11 = 0;
        iVar8 = 4;
      }
      pxVar4->cur = pxVar12;
      pxVar4->col = pxVar4->col + iVar8;
      htmlParseComment(ctxt,iVar11);
      htmlSkipBlankChars(ctxt);
      pxVar4 = ctxt->input;
      pxVar5 = pxVar4->cur;
      xVar1 = *pxVar5;
    }
    ctxt->instate = XML_PARSER_CONTENT;
    htmlParseContent(ctxt);
    if (*ctxt->input->cur == '\0') {
      htmlAutoCloseOnEnd(ctxt);
    }
    if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
       (p_Var7 = ctxt->sax->endDocument, p_Var7 != (endDocumentSAXFunc)0x0)) {
      (*p_Var7)(ctxt->userData);
    }
    if ((((ctxt->options & 4) == 0) && (ctxt->myDoc != (xmlDoc *)0x0)) &&
       (pxVar10 = xmlGetIntSubset(ctxt->myDoc), pxVar10 == (xmlDtdPtr)0x0)) {
      pxVar10 = xmlCreateIntSubset(ctxt->myDoc,"html",
                                   (xmlChar *)"-//W3C//DTD HTML 4.0 Transitional//EN",
                                   (xmlChar *)"http://www.w3.org/TR/REC-html40/loose.dtd");
      ctxt->myDoc->intSubset = pxVar10;
      if (pxVar10 == (xmlDtdPtr)0x0) {
        xmlCtxtErrMemory(ctxt);
      }
    }
    iVar8 = -(uint)(ctxt->wellFormed == 0);
  }
  return iVar8;
}

Assistant:

int
htmlParseDocument(htmlParserCtxtPtr ctxt) {
    xmlDtdPtr dtd;

    if ((ctxt == NULL) || (ctxt->input == NULL))
	return(-1);

    if ((ctxt->sax) && (ctxt->sax->setDocumentLocator)) {
        ctxt->sax->setDocumentLocator(ctxt->userData,
                (xmlSAXLocator *) &xmlDefaultSAXLocator);
    }

    xmlDetectEncoding(ctxt);

    /*
     * TODO: Implement HTML5 prescan algorithm
     */

    /*
     * This is wrong but matches long-standing behavior. In most
     * cases, a document starting with an XML declaration will
     * specify UTF-8. The HTML5 prescan algorithm handles
     * XML declarations in a better way.
     */
    if (((ctxt->input->flags & XML_INPUT_HAS_ENCODING) == 0) &&
        (xmlStrncmp(ctxt->input->cur, BAD_CAST "<?xm", 4) == 0))
        xmlSwitchEncoding(ctxt, XML_CHAR_ENCODING_UTF8);

    /*
     * Wipe out everything which is before the first '<'
     */
    SKIP_BLANKS;

    if ((ctxt->sax) && (ctxt->sax->startDocument) && (!ctxt->disableSAX))
	ctxt->sax->startDocument(ctxt->userData);

    /*
     * Parse possible comments and PIs before any content
     */
    while (CUR == '<') {
        if ((NXT(1) == '!') && (NXT(2) == '-') && (NXT(3) == '-')) {
            SKIP(4);
            htmlParseComment(ctxt, /* bogus */ 0);
        } else if (NXT(1) == '?') {
            SKIP(1);
            htmlParseComment(ctxt, /* bogus */ 1);
        } else {
            break;
        }
	SKIP_BLANKS;
    }

    /*
     * Then possibly doc type declaration(s) and more Misc
     * (doctypedecl Misc*)?
     */
    if ((CUR == '<') && (NXT(1) == '!') &&
	(UPP(2) == 'D') && (UPP(3) == 'O') &&
	(UPP(4) == 'C') && (UPP(5) == 'T') &&
	(UPP(6) == 'Y') && (UPP(7) == 'P') &&
	(UPP(8) == 'E')) {
        ctxt->instate = XML_PARSER_MISC;
	htmlParseDocTypeDecl(ctxt);
    }
    SKIP_BLANKS;

    /*
     * Parse possible comments and PIs before any content
     */
    ctxt->instate = XML_PARSER_PROLOG;
    while (CUR == '<') {
        if ((NXT(1) == '!') && (NXT(2) == '-') && (NXT(3) == '-')) {
            SKIP(4);
            htmlParseComment(ctxt, /* bogus */ 0);
        } else if (NXT(1) == '?') {
            SKIP(1);
            htmlParseComment(ctxt, /* bogus */ 1);
        } else {
            break;
        }
	SKIP_BLANKS;
    }

    /*
     * Time to start parsing the tree itself
     */
    ctxt->instate = XML_PARSER_CONTENT;
    htmlParseContent(ctxt);

    /*
     * autoclose
     */
    if (CUR == 0)
	htmlAutoCloseOnEnd(ctxt);


    /*
     * SAX: end of the document processing.
     */
    if ((ctxt->sax) && (ctxt->sax->endDocument != NULL))
        ctxt->sax->endDocument(ctxt->userData);

    if ((!(ctxt->options & HTML_PARSE_NODEFDTD)) && (ctxt->myDoc != NULL)) {
	dtd = xmlGetIntSubset(ctxt->myDoc);
	if (dtd == NULL) {
	    ctxt->myDoc->intSubset =
		xmlCreateIntSubset(ctxt->myDoc, BAD_CAST "html",
		    BAD_CAST "-//W3C//DTD HTML 4.0 Transitional//EN",
		    BAD_CAST "http://www.w3.org/TR/REC-html40/loose.dtd");
            if (ctxt->myDoc->intSubset == NULL)
                htmlErrMemory(ctxt);
        }
    }
    if (! ctxt->wellFormed) return(-1);
    return(0);
}